

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

u32string * __thiscall
cs::codecvt::ascii::local2wide_abi_cxx11_
          (u32string *__return_storage_ptr__,ascii *this,deque<char,_std::allocator<char>_> *local)

{
  _Elt_pointer local_48;
  _Elt_pointer pcStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  _Elt_pointer local_28;
  _Elt_pointer pcStack_20;
  _Elt_pointer local_18;
  _Map_pointer ppcStack_10;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_28 = (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
  pcStack_20 = (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
               super__Deque_impl_data._M_start._M_first;
  local_18 = (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last;
  ppcStack_10 = (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                super__Deque_impl_data._M_start._M_node;
  local_48 = (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
  pcStack_40 = (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_first;
  local_38 = *(undefined4 *)
              &(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_last;
  uStack_34 = *(undefined4 *)
               ((long)&(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                       super__Deque_impl_data._M_finish._M_last + 4);
  uStack_30 = *(undefined4 *)
               &(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
  uStack_2c = *(undefined4 *)
               ((long)&(local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4);
  std::__cxx11::u32string::_M_construct<std::_Deque_iterator<char,char_const&,char_const*>>
            ((u32string *)__return_storage_ptr__,&local_28,&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::u32string local2wide(const std::deque<char> &local) override
			{
				return std::u32string(local.begin(), local.end());
			}